

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O3

CommandLineFlag * __thiscall
google::anon_unknown_1::FlagRegistry::SplitArgumentLocked
          (FlagRegistry *this,char *arg,string *key,char **v,string *error_message)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  CommandLineFlag *pCVar4;
  long lVar5;
  string local_50;
  
  pcVar3 = strchr(arg,0x3d);
  if (pcVar3 == (char *)0x0) {
    pcVar1 = (char *)key->_M_string_length;
    strlen(arg);
    pcVar3 = (char *)0x0;
    std::__cxx11::string::_M_replace((ulong)key,0,pcVar1,(ulong)arg);
  }
  else {
    std::__cxx11::string::_M_replace((ulong)key,0,(char *)key->_M_string_length,(ulong)arg);
    pcVar3 = pcVar3 + 1;
  }
  *v = pcVar3;
  pcVar1 = (key->_M_dataplus)._M_p;
  pCVar4 = FindFlagLocked(this,pcVar1);
  if (pCVar4 != (CommandLineFlag *)0x0) {
    if (pcVar3 != (char *)0x0) {
      return pCVar4;
    }
    lVar5 = (long)pCVar4->defvalue_->type_;
    if (lVar5 < 7) {
      iVar2 = strcmp(&(anonymous_namespace)::FlagValue::TypeName()::types + lVar5 * 7,"bool");
      if (iVar2 != 0) {
        return pCVar4;
      }
      pcVar3 = "1";
LAB_00193be0:
      *v = pcVar3;
      return pCVar4;
    }
LAB_00193d09:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags.cc"
                  ,0x1a2,"const char *google::(anonymous namespace)::FlagValue::TypeName() const");
  }
  if ((*pcVar1 == 'n') && (pcVar1[1] == 'o')) {
    pcVar3 = pcVar1 + 2;
    pCVar4 = FindFlagLocked(this,pcVar3);
    if (pCVar4 != (CommandLineFlag *)0x0) {
      lVar5 = (long)pCVar4->defvalue_->type_;
      if (6 < lVar5) goto LAB_00193d09;
      iVar2 = strcmp(&(anonymous_namespace)::FlagValue::TypeName()::types + lVar5 * 7,"bool");
      if (iVar2 == 0) {
        pcVar1 = (char *)key->_M_string_length;
        strlen(pcVar3);
        std::__cxx11::string::_M_replace((ulong)key,0,pcVar1,(ulong)pcVar3);
        pcVar3 = "0";
        goto LAB_00193be0;
      }
      StringPrintf_abi_cxx11_
                (&local_50,"%sboolean value (%s) specified for %s command line flag\n","ERROR: ",
                 pcVar1,&(anonymous_namespace)::FlagValue::TypeName()::types + lVar5 * 7);
      std::__cxx11::string::operator=((string *)error_message,(string *)&local_50);
      goto LAB_00193cba;
    }
  }
  StringPrintf_abi_cxx11_(&local_50,"%sunknown command line flag \'%s\'\n","ERROR: ",pcVar1);
  std::__cxx11::string::operator=((string *)error_message,(string *)&local_50);
LAB_00193cba:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return (CommandLineFlag *)0x0;
}

Assistant:

CommandLineFlag* FlagRegistry::SplitArgumentLocked(const char* arg,
                                                   string* key,
                                                   const char** v,
                                                   string* error_message) {
  // Find the flag object for this option
  const char* flag_name;
  const char* value = strchr(arg, '=');
  if (value == NULL) {
    key->assign(arg);
    *v = NULL;
  } else {
    // Strip out the "=value" portion from arg
    key->assign(arg, value-arg);
    *v = ++value;    // advance past the '='
  }
  flag_name = key->c_str();

  CommandLineFlag* flag = FindFlagLocked(flag_name);

  if (flag == NULL) {
    // If we can't find the flag-name, then we should return an error.
    // The one exception is if 1) the flag-name is 'nox', 2) there
    // exists a flag named 'x', and 3) 'x' is a boolean flag.
    // In that case, we want to return flag 'x'.
    if (!(flag_name[0] == 'n' && flag_name[1] == 'o')) {
      // flag-name is not 'nox', so we're not in the exception case.
      *error_message = StringPrintf("%sunknown command line flag '%s'\n",
                                    kError, key->c_str());
      return NULL;
    }
    flag = FindFlagLocked(flag_name+2);
    if (flag == NULL) {
      // No flag named 'x' exists, so we're not in the exception case.
      *error_message = StringPrintf("%sunknown command line flag '%s'\n",
                                    kError, key->c_str());
      return NULL;
    }
    if (strcmp(flag->type_name(), "bool") != 0) {
      // 'x' exists but is not boolean, so we're not in the exception case.
      *error_message = StringPrintf(
          "%sboolean value (%s) specified for %s command line flag\n",
          kError, key->c_str(), flag->type_name());
      return NULL;
    }
    // We're in the exception case!
    // Make up a fake value to replace the "no" we stripped out
    key->assign(flag_name+2);   // the name without the "no"
    *v = "0";
  }

  // Assign a value if this is a boolean flag
  if (*v == NULL && strcmp(flag->type_name(), "bool") == 0) {
    *v = "1";    // the --nox case was already handled, so this is the --x case
  }

  return flag;
}